

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O2

Formula * __thiscall
Kernel::BottomUpTermTransformerFormulaTransformer::applyLiteral
          (BottomUpTermTransformerFormulaTransformer *this,Formula *f)

{
  Literal *lit;
  Literal *lit_00;
  
  lit = *(Literal **)(f + 1);
  lit_00 = TermTransformerCommon::transformLiteral
                     (&this->_termTransformer->super_TermTransformerCommon,lit);
  if (lit != lit_00) {
    f = (Formula *)AtomicFormula::operator_new(0x30);
    AtomicFormula::AtomicFormula((AtomicFormula *)f,lit_00);
  }
  return &((AtomicFormula *)f)->super_Formula;
}

Assistant:

Formula* BottomUpTermTransformerFormulaTransformer::applyLiteral(Formula* f)
{
  Literal* lit = f->literal();
  Literal* res = _termTransformer.transformLiteral(lit);
  if(lit==res) { return f; }
  return new AtomicFormula(res);
}